

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O0

JSModuleDef * js_module_loader(JSContext *ctx,char *module_name,void *opaque)

{
  int iVar1;
  JSValueUnion ptr;
  uint8_t *puVar2;
  undefined8 in_RSI;
  JSContext *in_RDI;
  JSValue JVar3;
  JSValue func_val;
  uint8_t *buf;
  size_t buf_len;
  JSModuleDef *m;
  int in_stack_00001038;
  int in_stack_0000103c;
  JSContext *in_stack_00001040;
  JSValue in_stack_00001048;
  undefined1 in_stack_ffffffffffffff98 [16];
  int eval_flags;
  JSContext *ctx_00;
  JSContext *ctx_01;
  JSValue in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffb8;
  JSContext *in_stack_ffffffffffffffc0;
  JSContext *in_stack_ffffffffffffffc8;
  JSContext *in_stack_fffffffffffffff8;
  
  eval_flags = in_stack_ffffffffffffff98._12_4_;
  iVar1 = has_suffix((char *)in_stack_ffffffffffffffa8.tag,(char *)in_stack_ffffffffffffffa8.u.ptr);
  if (iVar1 == 0) {
    puVar2 = js_load_file(in_stack_ffffffffffffffc8,(size_t *)in_stack_ffffffffffffffc0,
                          in_stack_ffffffffffffffb8);
    if (puVar2 == (uint8_t *)0x0) {
      JS_ThrowReferenceError(in_RDI,"could not load module filename \'%s\'",in_RSI);
      ptr.float64 = 0.0;
    }
    else {
      JVar3 = JS_Eval(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                      in_stack_ffffffffffffffa8.tag,(char *)in_stack_ffffffffffffffa8.u.ptr,
                      eval_flags);
      ptr = JVar3.u;
      ctx_00 = (JSContext *)JVar3.tag;
      ctx_01 = ctx_00;
      js_free(ctx_00,ptr.ptr);
      JVar3.tag = (int64_t)ctx_00;
      JVar3.u.ptr = ptr.ptr;
      iVar1 = JS_IsException(JVar3);
      if (iVar1 == 0) {
        js_module_set_import_meta
                  (in_stack_00001040,in_stack_00001048,in_stack_0000103c,in_stack_00001038);
        JS_FreeValue(ctx_01,in_stack_ffffffffffffffa8);
      }
      else {
        ptr.float64 = 0.0;
      }
    }
  }
  else {
    ptr.ptr = js_module_loader_so(in_stack_fffffffffffffff8,(char *)in_RDI);
  }
  return (JSModuleDef *)ptr.float64;
}

Assistant:

JSModuleDef *js_module_loader(JSContext *ctx,
                              const char *module_name, void *opaque)
{
    JSModuleDef *m;

    if (has_suffix(module_name, ".so")) {
        m = js_module_loader_so(ctx, module_name);
    } else {
        size_t buf_len;
        uint8_t *buf;
        JSValue func_val;
    
        buf = js_load_file(ctx, &buf_len, module_name);
        if (!buf) {
            JS_ThrowReferenceError(ctx, "could not load module filename '%s'",
                                   module_name);
            return NULL;
        }
        
        /* compile the module */
        func_val = JS_Eval(ctx, (char *)buf, buf_len, module_name,
                           JS_EVAL_TYPE_MODULE | JS_EVAL_FLAG_COMPILE_ONLY);
        js_free(ctx, buf);
        if (JS_IsException(func_val))
            return NULL;
        /* XXX: could propagate the exception */
        js_module_set_import_meta(ctx, func_val, TRUE, FALSE);
        /* the module is already referenced, so we must free it */
        m = JS_VALUE_GET_PTR(func_val);
        JS_FreeValue(ctx, func_val);
    }
    return m;
}